

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::FormatCountableNoun_abi_cxx11_(int count,char *singular_form,char *plural_form)

{
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *local_90;
  int *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char *local_20;
  char *local_18;
  int local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  internal::StreamableToString<int>(in_stack_ffffffffffffff98);
  std::operator+(&local_40,&local_60," ");
  if (local_c == 1) {
    local_90 = local_18;
  }
  else {
    local_90 = local_20;
  }
  std::operator+(in_RDI,&local_40,local_90);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return in_RDI;
}

Assistant:

static std::string FormatCountableNoun(int count,
                                       const char * singular_form,
                                       const char * plural_form) {
  return internal::StreamableToString(count) + " " +
      (count == 1 ? singular_form : plural_form);
}